

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_opc_special_tx79(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  uint32_t rs_00;
  uint32_t rt_00;
  uint32_t rd_00;
  uint opc;
  uint32_t op1;
  int rd;
  int rt;
  int rs;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  rs_00 = extract32(ctx->opcode,0x15,5);
  rt_00 = extract32(ctx->opcode,0x10,5);
  rd_00 = extract32(ctx->opcode,0xb,5);
  opc = ctx->opcode & 0xfc00003f;
  switch(opc) {
  case 8:
    gen_compute_branch(ctx,opc,4,rs_00,0,0,4);
    break;
  default:
    generate_exception_end(ctx,0x14);
    break;
  case 10:
  case 0xb:
    gen_cond_move(ctx,opc,rd_00,rs_00,rt_00);
    break;
  case 0x10:
  case 0x12:
    gen_HILO(ctx,opc,0,rd_00);
    break;
  case 0x11:
  case 0x13:
    gen_HILO(ctx,opc,0,rs_00);
    break;
  case 0x18:
  case 0x19:
    gen_mul_txx9(ctx,opc,rd_00,rs_00,rt_00);
    break;
  case 0x1a:
  case 0x1b:
    gen_muldiv(ctx,opc,0,rs_00,rt_00);
    break;
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    check_insn_opc_user_only(ctx,0x8000000000000);
    gen_muldiv(ctx,opc,0,rs_00,rt_00);
  }
  return;
}

Assistant:

static void decode_opc_special_tx79(CPUMIPSState *env, DisasContext *ctx)
{
    int rs = extract32(ctx->opcode, 21, 5);
    int rt = extract32(ctx->opcode, 16, 5);
    int rd = extract32(ctx->opcode, 11, 5);
    uint32_t op1 = MASK_SPECIAL(ctx->opcode);

    switch (op1) {
    case OPC_MOVN:         /* Conditional move */
    case OPC_MOVZ:
        gen_cond_move(ctx, op1, rd, rs, rt);
        break;
    case OPC_MFHI:          /* Move from HI/LO */
    case OPC_MFLO:
        gen_HILO(ctx, op1, 0, rd);
        break;
    case OPC_MTHI:
    case OPC_MTLO:          /* Move to HI/LO */
        gen_HILO(ctx, op1, 0, rs);
        break;
    case OPC_MULT:
    case OPC_MULTU:
        gen_mul_txx9(ctx, op1, rd, rs, rt);
        break;
    case OPC_DIV:
    case OPC_DIVU:
        gen_muldiv(ctx, op1, 0, rs, rt);
        break;
#if defined(TARGET_MIPS64)
    case OPC_DMULT:
    case OPC_DMULTU:
    case OPC_DDIV:
    case OPC_DDIVU:
        check_insn_opc_user_only(ctx, INSN_R5900);
        gen_muldiv(ctx, op1, 0, rs, rt);
        break;
#endif
    case OPC_JR:
        gen_compute_branch(ctx, op1, 4, rs, 0, 0, 4);
        break;
    default:            /* Invalid */
        MIPS_INVAL("special_tx79");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}